

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O1

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  
  lVar10 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = *(double *)((long)user_data + 0x18);
  dVar4 = *(double *)((long)user_data + 0x28);
  lVar7 = N_VGetArrayPointer();
  if ((lVar7 != 0) && (lVar8 = N_VGetArrayPointer(ydot), lVar8 != 0)) {
    if (lVar10 < 1) {
      return 0;
    }
    lVar9 = 0x10;
    do {
      pdVar1 = (double *)(lVar7 + -0x10 + lVar9);
      dVar6 = *pdVar1;
      dVar5 = *(double *)(lVar7 + lVar9);
      dVar11 = pdVar1[1] * dVar6;
      pdVar1 = (double *)(lVar8 + -0x10 + lVar9);
      *pdVar1 = dVar6 * dVar11 + (dVar2 - (dVar5 + 1.0) * dVar6);
      pdVar1[1] = dVar6 * dVar5 + -dVar11 * dVar6;
      *(double *)(lVar8 + lVar9) = (dVar3 - dVar5) / dVar4 - dVar5 * dVar6;
      lVar9 = lVar9 + 0x18;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    return 0;
  }
  ff_cold_1();
  return 1;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata      = (UserData)user_data; /* access problem data    */
  sunindextype N      = udata->N;            /* set variable shortcuts */
  sunrealtype a       = udata->a;
  sunrealtype b       = udata->b;
  sunrealtype ep      = udata->ep;
  sunrealtype* Ydata  = NULL;
  sunrealtype* dYdata = NULL;
  sunrealtype u, v, w;
  sunindextype i;

  /* access data arrays */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing reactions */
  for (i = 0; i < N; i++)
  {
    /* set shortcuts */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* u_t = a - (w+1)*u + v*u^2 */
    dYdata[IDX(i, 0)] = a - (w + ONE) * u + v * u * u;

    /* v_t = w*u - v*u^2 */
    dYdata[IDX(i, 1)] = w * u - v * u * u;

    /* w_t = (b-w)/ep - w*u */
    dYdata[IDX(i, 2)] = (b - w) / ep - w * u;
  }

  /* return success */
  return (0);
}